

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int8_t estimate_wedge_sign(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *pred0,int stride0,
                          uint8_t *pred1,int stride1)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  ulong in_RCX;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  ulong in_R9;
  int in_stack_00000008;
  BLOCK_SIZE f_index;
  int64_t br;
  int64_t tl;
  uint32_t esq [2] [2];
  int bh_by2;
  int bw_by2;
  int bh;
  int bw;
  int src_stride;
  uint8_t *src;
  macroblock_plane *p;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c [2];
  int local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  long local_40;
  ulong local_30;
  int local_24;
  ulong local_20;
  long *local_8;
  
  local_40 = *(long *)(in_RSI + 0x30);
  local_44 = *(int *)(in_RSI + 0x48);
  local_48 = (uint)block_size_wide[in_DL];
  local_4c = (uint)block_size_high[in_DL];
  local_50 = (int)local_48 >> 1;
  local_54 = (int)local_4c >> 1;
  BVar1 = estimate_wedge_sign::split_qtr[in_DL];
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_8 = in_RDI;
  iVar2 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  if (iVar2 != 0) {
    local_20 = local_20 >> 1;
    local_30 = local_30 >> 1;
  }
  (**(code **)(*local_8 + (ulong)BVar1 * 0x70 + 0xc918))
            (local_40,local_44,local_20,local_24,&local_68);
  (**(code **)(*local_8 + (ulong)BVar1 * 0x70 + 0xc918))
            (local_40 + local_54 * local_44 + (long)local_50,local_44,
             local_20 + (long)(local_54 * local_24) + (long)local_50,local_24,&local_64);
  (**(code **)(*local_8 + (ulong)BVar1 * 0x70 + 0xc918))
            (local_40,local_44,local_30,in_stack_00000008,&local_60);
  (**(code **)(*local_8 + (ulong)BVar1 * 0x70 + 0xc918))
            (local_40 + local_54 * local_44 + (long)local_50,local_44,
             local_30 + (long)(local_54 * in_stack_00000008) + (long)local_50,local_24,local_5c);
  return 0 < (long)(((ulong)local_68 - (ulong)local_60) + ((ulong)local_5c[0] - (ulong)local_64));
}

Assistant:

static int8_t estimate_wedge_sign(const AV1_COMP *cpi, const MACROBLOCK *x,
                                  const BLOCK_SIZE bsize, const uint8_t *pred0,
                                  int stride0, const uint8_t *pred1,
                                  int stride1) {
  static const BLOCK_SIZE split_qtr[BLOCK_SIZES_ALL] = {
    //                            4X4
    BLOCK_INVALID,
    // 4X8,        8X4,           8X8
    BLOCK_INVALID, BLOCK_INVALID, BLOCK_4X4,
    // 8X16,       16X8,          16X16
    BLOCK_4X8, BLOCK_8X4, BLOCK_8X8,
    // 16X32,      32X16,         32X32
    BLOCK_8X16, BLOCK_16X8, BLOCK_16X16,
    // 32X64,      64X32,         64X64
    BLOCK_16X32, BLOCK_32X16, BLOCK_32X32,
    // 64x128,     128x64,        128x128
    BLOCK_32X64, BLOCK_64X32, BLOCK_64X64,
    // 4X16,       16X4,          8X32
    BLOCK_INVALID, BLOCK_INVALID, BLOCK_4X16,
    // 32X8,       16X64,         64X16
    BLOCK_16X4, BLOCK_8X32, BLOCK_32X8
  };
  const struct macroblock_plane *const p = &x->plane[0];
  const uint8_t *src = p->src.buf;
  int src_stride = p->src.stride;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int bw_by2 = bw >> 1;
  const int bh_by2 = bh >> 1;
  uint32_t esq[2][2];
  int64_t tl, br;

  const BLOCK_SIZE f_index = split_qtr[bsize];
  assert(f_index != BLOCK_INVALID);

  if (is_cur_buf_hbd(&x->e_mbd)) {
    pred0 = CONVERT_TO_BYTEPTR(pred0);
    pred1 = CONVERT_TO_BYTEPTR(pred1);
  }

  // Residual variance computation over relevant quandrants in order to
  // find TL + BR, TL = sum(1st,2nd,3rd) quadrants of (pred0 - pred1),
  // BR = sum(2nd,3rd,4th) quadrants of (pred1 - pred0)
  // The 2nd and 3rd quadrants cancel out in TL + BR
  // Hence TL + BR = 1st quadrant of (pred0-pred1) + 4th of (pred1-pred0)
  // TODO(nithya): Sign estimation assumes 45 degrees (1st and 4th quadrants)
  // for all codebooks; experiment with other quadrant combinations for
  // 0, 90 and 135 degrees also.
  cpi->ppi->fn_ptr[f_index].vf(src, src_stride, pred0, stride0, &esq[0][0]);
  cpi->ppi->fn_ptr[f_index].vf(src + bh_by2 * src_stride + bw_by2, src_stride,
                               pred0 + bh_by2 * stride0 + bw_by2, stride0,
                               &esq[0][1]);
  cpi->ppi->fn_ptr[f_index].vf(src, src_stride, pred1, stride1, &esq[1][0]);
  cpi->ppi->fn_ptr[f_index].vf(src + bh_by2 * src_stride + bw_by2, src_stride,
                               pred1 + bh_by2 * stride1 + bw_by2, stride0,
                               &esq[1][1]);

  tl = ((int64_t)esq[0][0]) - ((int64_t)esq[1][0]);
  br = ((int64_t)esq[1][1]) - ((int64_t)esq[0][1]);
  return (tl + br > 0);
}